

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O2

void cali_begin_string_byname(char *attr_name,char *val)

{
  size_t size;
  allocator<char> local_69;
  cali_variant_t local_68;
  Attribute attr;
  Caliper c;
  
  cali::Caliper::Caliper(&c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,attr_name,&local_69);
  attr = cali::Caliper::create_attribute
                   (&c,(string *)&local_68,CALI_TYPE_STRING,0,0,(Attribute *)0x0,(Variant *)0x0);
  std::__cxx11::string::~string((string *)&local_68);
  size = strlen(val);
  local_68 = cali_make_variant(CALI_TYPE_STRING,val,size);
  cali::Caliper::begin(&c,&attr,(Variant *)&local_68);
  return;
}

Assistant:

void cali_begin_string_byname(const char* attr_name, const char* val)
{
    Caliper   c;
    Attribute attr = c.create_attribute(attr_name, CALI_TYPE_STRING, CALI_ATTR_DEFAULT);

    c.begin(attr, Variant(CALI_TYPE_STRING, val, strlen(val)));
}